

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

int __thiscall google::protobuf::internal::ExtensionSet::NumExtensions(ExtensionSet *this)

{
  LargeMap *pLVar1;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_> it;
  KeyValue *pKVar2;
  KeyValue *pKVar3;
  _Rb_tree_node_base *p_Var4;
  int iVar5;
  KeyValue *it_1;
  
  if ((short)this->flat_size_ < 0) {
    pLVar1 = (this->map_).large;
    iVar5 = 0;
    for (p_Var4 = (pLVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(pLVar1->_M_t)._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      iVar5 = iVar5 + (~(uint)*(byte *)((long)&p_Var4[1]._M_left + 2) & 1);
    }
  }
  else {
    pKVar2 = flat_begin(this);
    pKVar3 = flat_end(this);
    iVar5 = 0;
    for (; pKVar2 != pKVar3; pKVar2 = pKVar2 + 1) {
      iVar5 = iVar5 + (~(uint)(byte)(pKVar2->second).field_0xa & 1);
    }
  }
  return iVar5;
}

Assistant:

int ExtensionSet::NumExtensions() const {
  int result = 0;
  ForEach([&result](int /* number */, const Extension& ext) {
    if (!ext.is_cleared) {
      ++result;
    }
  });
  return result;
}